

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O0

LocalSet * __thiscall wasm::Pusher::isPushable(Pusher *this,Expression *curr)

{
  Index IVar1;
  bool bVar2;
  bool bVar3;
  Index IVar4;
  reference pvVar5;
  byte local_1b1;
  EffectAnalyzer local_190;
  uint local_2c;
  Pusher *pPStack_28;
  Index index;
  LocalSet *set;
  Expression *curr_local;
  Pusher *this_local;
  
  set = (LocalSet *)curr;
  curr_local = (Expression *)this;
  pPStack_28 = (Pusher *)Expression::dynCast<wasm::LocalSet>(curr);
  if (pPStack_28 == (Pusher *)0x0) {
    this_local = (Pusher *)0x0;
  }
  else {
    local_2c = *(uint *)&pPStack_28->numGetsSoFar;
    bVar3 = LocalAnalyzer::isSFA(this->analyzer,local_2c);
    bVar2 = false;
    local_1b1 = 0;
    if (bVar3) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (this->numGetsSoFar,(ulong)local_2c);
      IVar1 = *pvVar5;
      IVar4 = LocalAnalyzer::getNumGets(this->analyzer,local_2c);
      local_1b1 = 0;
      if (IVar1 == IVar4) {
        EffectAnalyzer::EffectAnalyzer
                  (&local_190,this->passOptions,this->module,(Expression *)pPStack_28->passOptions);
        bVar2 = true;
        bVar3 = EffectAnalyzer::hasUnremovableSideEffects(&local_190);
        local_1b1 = bVar3 ^ 0xff;
      }
    }
    if (bVar2) {
      EffectAnalyzer::~EffectAnalyzer(&local_190);
    }
    if ((local_1b1 & 1) == 0) {
      this_local = (Pusher *)0x0;
    }
    else {
      this_local = pPStack_28;
    }
  }
  return (LocalSet *)this_local;
}

Assistant:

LocalSet* isPushable(Expression* curr) {
    auto* set = curr->dynCast<LocalSet>();
    if (!set) {
      return nullptr;
    }
    auto index = set->index;
    // To be pushable, this must be SFA and the right # of gets.
    //
    // It must also not have side effects, as it may no longer execute after it
    // is pushed, since it may be behind a condition that ends up false some of
    // the time. However, removable side effects are ok here. The general
    // problem with removable effects is that we can only remove them, but not
    // move them, because of stuff like this:
    //
    //   if (x != 0) foo(1 / x);
    //
    // If we move 1 / x to execute unconditionally then it may trap, but it
    // would be fine to remove it. This pass does not move code to places where
    // it might execute more, but *less*: we keep the code behind any conditions
    // it was already behind, and potentially put it behind further ones. In
    // effect, we "partially remove" the code, making it not execute some of the
    // time, which is fine.
    if (analyzer.isSFA(index) &&
        numGetsSoFar[index] == analyzer.getNumGets(index) &&
        !EffectAnalyzer(passOptions, module, set->value)
           .hasUnremovableSideEffects()) {
      return set;
    }
    return nullptr;
  }